

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O0

void __thiscall Minisat::vec<Minisat::Option_*>::capacity(vec<Minisat::Option_*> *this,int min_cap)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  int *piVar4;
  int in_ESI;
  undefined8 *in_RDI;
  Option **newdata;
  int add;
  
  if (*(int *)((long)in_RDI + 0xc) < in_ESI) {
    iVar1 = imax((in_ESI - *(int *)((long)in_RDI + 0xc)) + 1U & 0xfffffffe,
                 (*(int *)((long)in_RDI + 0xc) >> 1) + 2U & 0xfffffffe);
    if (0x7fffffff - *(int *)((long)in_RDI + 0xc) < iVar1) {
      uVar2 = __cxa_allocate_exception(1);
      __cxa_throw(uVar2,&OutOfMemoryException::typeinfo,0);
    }
    pvVar3 = realloc((void *)*in_RDI,(long)(*(int *)((long)in_RDI + 0xc) + iVar1) << 3);
    if ((pvVar3 == (void *)0x0) && (piVar4 = __errno_location(), *piVar4 == 0xc)) {
      uVar2 = __cxa_allocate_exception(1);
      __cxa_throw(uVar2,&OutOfMemoryException::typeinfo,0);
    }
    *(int *)((long)in_RDI + 0xc) = iVar1 + *(int *)((long)in_RDI + 0xc);
    *in_RDI = pvVar3;
  }
  return;
}

Assistant:

void vec<T>::capacity(int min_cap)
{
    if (cap >= min_cap) return;
    int add = imax((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1); // NOTE: grow by approximately 3/2
    if (add > INT_MAX - cap) throw OutOfMemoryException();

    T *newdata = (T *)::realloc(data, (cap + add) * sizeof(T));
    if (newdata == NULL && errno == ENOMEM) throw OutOfMemoryException();

    cap += add;
    data = newdata;
}